

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

void ngram_compute_seg_score
               (ngram_search_t *ngs,bptbl_t *be,float32 lwf,int32 *out_ascr,int32 *out_lscr)

{
  int iVar1;
  int32 iVar2;
  int32 local_40;
  int32 local_3c;
  int32 n_used;
  int32 start_score;
  bptbl_t *pbe;
  int32 *out_lscr_local;
  int32 *out_ascr_local;
  bptbl_t *pbStack_18;
  float32 lwf_local;
  bptbl_t *be_local;
  ngram_search_t *ngs_local;
  
  if (be->bp == -1) {
    *out_ascr = be->score;
    *out_lscr = 0;
  }
  else {
    _n_used = ngs->bp_table + be->bp;
    pbe = (bptbl_t *)out_lscr;
    out_lscr_local = out_ascr;
    out_ascr_local._4_4_ = lwf;
    pbStack_18 = be;
    be_local = (bptbl_t *)ngs;
    local_3c = ngram_search_exit_score(ngs,_n_used,(int)*((ngs->base).dict)->word[be->wid].ciphone);
    if (local_3c < -0x1fffffff) {
      __assert_fail("start_score BETTER_THAN WORST_SCORE",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                    ,0x2b9,
                    "void ngram_compute_seg_score(ngram_search_t *, bptbl_t *, float32, int32 *, int32 *)"
                   );
    }
    if (pbStack_18->wid == be_local[2].prev_real_wid) {
      pbe->frame = *(frame_idx_t *)&be_local[0x13].valid;
    }
    else {
      iVar1 = dict_filler_word(*(dict_t **)&be_local[1].bp,pbStack_18->wid);
      if (iVar1 == 0) {
        iVar2 = ngram_tg_score(*(ngram_model_t **)&be_local[3].valid,pbStack_18->real_wid,
                               _n_used->real_wid,_n_used->prev_real_wid,&local_40);
        pbe->frame = iVar2 >> 10;
        pbe->frame = (int)((float)pbe->frame * (float)out_ascr_local._4_4_);
      }
      else {
        pbe->frame = be_local[0x13].frame;
      }
    }
    *out_lscr_local = (pbStack_18->score - local_3c) - pbe->frame;
  }
  return;
}

Assistant:

void
ngram_compute_seg_score(ngram_search_t *ngs, bptbl_t *be, float32 lwf,
                        int32 *out_ascr, int32 *out_lscr)
{
    bptbl_t *pbe;
    int32 start_score;

    /* Start of utterance. */
    if (be->bp == NO_BP) {
        *out_ascr = be->score;
        *out_lscr = 0;
        return;
    }

    /* Otherwise, calculate lscr and ascr. */
    pbe = ngs->bp_table + be->bp;
    start_score = ngram_search_exit_score(ngs, pbe,
                                 dict_first_phone(ps_search_dict(ngs),be->wid));
    assert(start_score BETTER_THAN WORST_SCORE);

    /* FIXME: These result in positive acoustic scores when filler
       words have non-filler pronunciations.  That whole business
       is still pretty much broken but at least it doesn't
       segfault. */
    if (be->wid == ps_search_silence_wid(ngs)) {
        *out_lscr = ngs->silpen;
    }
    else if (dict_filler_word(ps_search_dict(ngs), be->wid)) {
        *out_lscr = ngs->fillpen;
    }
    else {
        int32 n_used;
        *out_lscr = ngram_tg_score(ngs->lmset,
                                   be->real_wid,
                                   pbe->real_wid,
                                   pbe->prev_real_wid,
                                   &n_used)>>SENSCR_SHIFT;
        *out_lscr = *out_lscr * lwf;
    }
    *out_ascr = be->score - start_score - *out_lscr;
}